

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

int Ga2_GlaAbsCount(Ga2_Man_t *p,int fRo,int fAnd)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  undefined8 uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  if (fRo == 0) {
    if (fAnd == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                    ,0x54a,"int Ga2_GlaAbsCount(Ga2_Man_t *, int, int)");
    }
    lVar6 = (long)p->vAbs->nSize;
    if (0 < lVar6) {
      lVar7 = 0;
      iVar5 = 0;
      while( true ) {
        iVar1 = p->vAbs->pArray[lVar7];
        if (((long)iVar1 < 0) || (p->pGia->nObjs <= iVar1)) break;
        pGVar4 = p->pGia->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) {
          return iVar5;
        }
        uVar8 = *(uint *)(pGVar4 + iVar1);
        iVar5 = iVar5 + (uint)((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8);
        lVar7 = lVar7 + 1;
        if (lVar6 == lVar7) {
          return iVar5;
        }
      }
      goto LAB_00608c61;
    }
  }
  else {
    lVar6 = (long)p->vAbs->nSize;
    if (0 < lVar6) {
      pGVar2 = p->pGia;
      lVar7 = 0;
      iVar5 = 0;
      while( true ) {
        iVar1 = p->vAbs->pArray[lVar7];
        if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) break;
        if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
          return iVar5;
        }
        uVar3 = *(undefined8 *)(pGVar2->pObjs + iVar1);
        uVar8 = 0;
        if ((~(uint)uVar3 & 0x9fffffff) == 0) {
          uVar8 = (uint)(pGVar2->vCis->nSize - pGVar2->nRegs <=
                        (int)((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff));
        }
        iVar5 = iVar5 + uVar8;
        lVar7 = lVar7 + 1;
        if (lVar6 == lVar7) {
          return iVar5;
        }
      }
LAB_00608c61:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  return 0;
}

Assistant:

int Ga2_GlaAbsCount( Ga2_Man_t * p, int fRo, int fAnd )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( fRo )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsRo(p->pGia, pObj);
    else if ( fAnd )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsAnd(pObj);
    else assert( 0 );
    return Counter;
}